

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

void Model<BaseUser>::readFromFile(string *filename)

{
  long lVar1;
  long *plVar2;
  fstream file;
  pair<int,_BaseUser> local_428;
  undefined **local_330;
  int local_328;
  undefined1 local_324 [228];
  string local_240 [528];
  
  std::fstream::fstream(local_240);
  std::fstream::open(local_240,(_Ios_Openmode)filename);
  if (objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_328 = 1;
  }
  else {
    lVar1 = std::_Rb_tree_decrement(&objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    local_328 = *(int *)(lVar1 + 0x30) + 1;
  }
  local_330 = &PTR_save_0012bef8;
  memset(local_324,0,0xe1);
  while( true ) {
    plVar2 = (long *)std::istream::read((char *)local_240,(long)&local_330);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    local_428.first = local_328;
    local_428.second.super_Model<BaseUser>.id = local_328;
    local_428.second.super_Model<BaseUser>._vptr_Model = (_func_int **)&PTR_save_0012bef8;
    memcpy(&local_428.second.super_Model<BaseUser>.field_0xc,local_324,0xe1);
    std::
    _Rb_tree<int,std::pair<int_const,BaseUser>,std::_Select1st<std::pair<int_const,BaseUser>>,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>>
    ::_M_emplace_unique<std::pair<int,BaseUser>>
              ((_Rb_tree<int,std::pair<int_const,BaseUser>,std::_Select1st<std::pair<int_const,BaseUser>>,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>>
                *)&objectList,&local_428);
  }
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}